

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osh_calc.cpp
# Opt level: O1

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long this;
  char cVar2;
  bool bVar3;
  mapped_type *pp_Var4;
  mapped_type *pp_Var5;
  istream *piVar6;
  ostream *poVar7;
  undefined8 *puVar8;
  string line;
  CalcReader reader;
  key_type local_2b8;
  char local_291;
  long *local_290;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_288;
  long local_280 [2];
  storage_union local_270;
  long local_260;
  CalcReader local_258;
  
  Omega_h::math_lang::ask_reader_tables();
  Omega_h::Reader::Reader(&local_258.super_Reader,&local_290);
  if (local_288 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_288);
  }
  this = (long)&local_258 + 0x198;
  local_258._0_8_ = &PTR__CalcReader_00109c78;
  local_258.unary_function_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)((long)&local_258 + 0x1a0);
  local_258.unary_function_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_258.unary_function_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_258.unary_function_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_258.binary_function_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)((long)&local_258 + 0x1d0);
  local_258.binary_function_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_258.binary_function_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_258.binary_function_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_258.variable_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)((long)&local_258 + 0x200);
  local_258.variable_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_258.variable_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_258.variable_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  paVar1 = &local_2b8.field_2;
  local_2b8.field_2._M_allocated_capacity._0_4_ = 0x74727173;
  local_2b8._M_string_length = 4;
  local_2b8.field_2._M_local_buf[4] = '\0';
  local_2b8._M_dataplus._M_p = (pointer)paVar1;
  local_258.unary_function_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_258.unary_function_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_258.binary_function_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_258.binary_function_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_258.variable_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_258.variable_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pp_Var4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double)>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double)>_>_>
                          *)this,&local_2b8);
  *pp_Var4 = sqrt;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p,
                    CONCAT26(local_2b8.field_2._M_allocated_capacity._6_2_,
                             CONCAT15(local_2b8.field_2._M_local_buf[5],
                                      CONCAT14(local_2b8.field_2._M_local_buf[4],
                                               local_2b8.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  local_2b8.field_2._M_allocated_capacity._0_4_ = 0x6e6973;
  local_2b8._M_string_length = 3;
  local_2b8._M_dataplus._M_p = (pointer)paVar1;
  pp_Var4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double)>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double)>_>_>
                          *)this,&local_2b8);
  *pp_Var4 = sin;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p,
                    CONCAT26(local_2b8.field_2._M_allocated_capacity._6_2_,
                             CONCAT15(local_2b8.field_2._M_local_buf[5],
                                      CONCAT14(local_2b8.field_2._M_local_buf[4],
                                               local_2b8.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  local_2b8.field_2._M_allocated_capacity._0_4_ = 0x736f63;
  local_2b8._M_string_length = 3;
  local_2b8._M_dataplus._M_p = (pointer)paVar1;
  pp_Var4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double)>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double)>_>_>
                          *)this,&local_2b8);
  *pp_Var4 = cos;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p,
                    CONCAT26(local_2b8.field_2._M_allocated_capacity._6_2_,
                             CONCAT15(local_2b8.field_2._M_local_buf[5],
                                      CONCAT14(local_2b8.field_2._M_local_buf[4],
                                               local_2b8.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  local_2b8.field_2._M_allocated_capacity._0_4_ = 0x6e6174;
  local_2b8._M_string_length = 3;
  local_2b8._M_dataplus._M_p = (pointer)paVar1;
  pp_Var4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double)>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double)>_>_>
                          *)this,&local_2b8);
  *pp_Var4 = tan;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p,
                    CONCAT26(local_2b8.field_2._M_allocated_capacity._6_2_,
                             CONCAT15(local_2b8.field_2._M_local_buf[5],
                                      CONCAT14(local_2b8.field_2._M_local_buf[4],
                                               local_2b8.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  local_2b8.field_2._M_allocated_capacity._0_4_ = 0x6e697361;
  local_2b8._M_string_length = 4;
  local_2b8.field_2._M_local_buf[4] = '\0';
  local_2b8._M_dataplus._M_p = (pointer)paVar1;
  pp_Var4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double)>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double)>_>_>
                          *)this,&local_2b8);
  *pp_Var4 = asin;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p,
                    CONCAT26(local_2b8.field_2._M_allocated_capacity._6_2_,
                             CONCAT15(local_2b8.field_2._M_local_buf[5],
                                      CONCAT14(local_2b8.field_2._M_local_buf[4],
                                               local_2b8.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  local_2b8.field_2._M_allocated_capacity._0_4_ = 0x736f6361;
  local_2b8._M_string_length = 4;
  local_2b8.field_2._M_local_buf[4] = '\0';
  local_2b8._M_dataplus._M_p = (pointer)paVar1;
  pp_Var4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double)>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double)>_>_>
                          *)this,&local_2b8);
  *pp_Var4 = acos;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p,
                    CONCAT26(local_2b8.field_2._M_allocated_capacity._6_2_,
                             CONCAT15(local_2b8.field_2._M_local_buf[5],
                                      CONCAT14(local_2b8.field_2._M_local_buf[4],
                                               local_2b8.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  local_2b8.field_2._M_allocated_capacity._0_4_ = 0x6e617461;
  local_2b8._M_string_length = 4;
  local_2b8.field_2._M_local_buf[4] = '\0';
  local_2b8._M_dataplus._M_p = (pointer)paVar1;
  pp_Var4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double)>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double)>_>_>
                          *)this,&local_2b8);
  *pp_Var4 = atan;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p,
                    CONCAT26(local_2b8.field_2._M_allocated_capacity._6_2_,
                             CONCAT15(local_2b8.field_2._M_local_buf[5],
                                      CONCAT14(local_2b8.field_2._M_local_buf[4],
                                               local_2b8.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  local_2b8.field_2._M_allocated_capacity._0_4_ = 0x707865;
  local_2b8._M_string_length = 3;
  local_2b8._M_dataplus._M_p = (pointer)paVar1;
  pp_Var4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double)>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double)>_>_>
                          *)this,&local_2b8);
  *pp_Var4 = exp;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p,
                    CONCAT26(local_2b8.field_2._M_allocated_capacity._6_2_,
                             CONCAT15(local_2b8.field_2._M_local_buf[5],
                                      CONCAT14(local_2b8.field_2._M_local_buf[4],
                                               local_2b8.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  local_2b8.field_2._M_allocated_capacity._0_4_ = 0x676f6c;
  local_2b8._M_string_length = 3;
  local_2b8._M_dataplus._M_p = (pointer)paVar1;
  pp_Var4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double)>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double)>_>_>
                          *)this,&local_2b8);
  *pp_Var4 = log;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p,
                    CONCAT26(local_2b8.field_2._M_allocated_capacity._6_2_,
                             CONCAT15(local_2b8.field_2._M_local_buf[5],
                                      CONCAT14(local_2b8.field_2._M_local_buf[4],
                                               local_2b8.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  local_2b8.field_2._M_allocated_capacity._0_4_ = 0x31676f6c;
  local_2b8.field_2._M_local_buf[4] = '0';
  local_2b8.field_2._M_local_buf[5] = '\0';
  local_2b8._M_string_length = 5;
  local_2b8._M_dataplus._M_p = (pointer)paVar1;
  pp_Var4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double)>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double)>_>_>
                          *)this,&local_2b8);
  *pp_Var4 = log10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p,
                    CONCAT26(local_2b8.field_2._M_allocated_capacity._6_2_,
                             CONCAT15(local_2b8.field_2._M_local_buf[5],
                                      CONCAT14(local_2b8.field_2._M_local_buf[4],
                                               local_2b8.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  local_2b8.field_2._M_allocated_capacity._0_4_ = 0x6e617461;
  local_2b8.field_2._M_local_buf[4] = '2';
  local_2b8.field_2._M_local_buf[5] = '\0';
  local_2b8._M_string_length = 5;
  local_2b8._M_dataplus._M_p = (pointer)paVar1;
  pp_Var5 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double,_double),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double,_double)>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double,_double),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(*)(double,_double)>_>_>
                          *)((long)&local_258 + 0x1c8),&local_2b8);
  *pp_Var5 = atan2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p,
                    CONCAT26(local_2b8.field_2._M_allocated_capacity._6_2_,
                             CONCAT15(local_2b8.field_2._M_local_buf[5],
                                      CONCAT14(local_2b8.field_2._M_local_buf[4],
                                               local_2b8.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  local_2b8._M_string_length = 0;
  local_2b8.field_2._M_allocated_capacity._0_4_ =
       local_2b8.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  local_2b8._M_dataplus._M_p = (pointer)paVar1;
  while( true ) {
    cVar2 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x18);
    piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&std::cin,(string *)&local_2b8,cVar2);
    if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,
                        CONCAT26(local_2b8.field_2._M_allocated_capacity._6_2_,
                                 CONCAT15(local_2b8.field_2._M_local_buf[5],
                                          CONCAT14(local_2b8.field_2._M_local_buf[4],
                                                   local_2b8.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      anon_unknown.dwarf_9197::CalcReader::~CalcReader(&local_258);
      return 0;
    }
    local_290 = local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"input","");
    Omega_h::Reader::read_string((string *)&local_270,(string *)&local_258);
    bVar3 = Omega_h::any::is_typed((any *)&local_270,(type_info *)&double::typeinfo);
    if (!bVar3) break;
    poVar7 = std::ostream::_M_insert<double>((double)local_270.dynamic);
    local_291 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_291,1);
    if (local_260 != 0) {
      (**(code **)(local_260 + 8))(&local_270);
      local_260 = 0;
    }
    if (local_290 != local_280) {
      operator_delete(local_290,local_280[0] + 1);
    }
  }
  puVar8 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar8 = std::__cxx11::string::_M_create;
  __cxa_throw(puVar8,&Omega_h::bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

int main() {
  CalcReader reader;
  for (std::string line; std::getline(std::cin, line);) {
    std::cout << Omega_h::any_cast<double>(reader.read_string("input", line))
              << '\n';
  }
}